

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  bool bVar13;
  
  lVar11 = 0;
  do {
    sVar2 = stbi__get8(s);
    psVar1 = (stbi_uc *)(anon_var_dwarf_31a5 + lVar11);
    if (sVar2 != *psVar1) break;
    bVar13 = lVar11 != 3;
    lVar11 = lVar11 + 1;
  } while (bVar13);
  if (sVar2 != *psVar1) goto LAB_00110dec;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00110d4b:
    s->img_buffer = s->img_buffer + 0x58;
  }
  else {
    iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0x57 < iVar7) goto LAB_00110d4b;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar7);
  }
  sVar2 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  if (x != (int *)0x0) {
    *x = (uint)CONCAT11(sVar2,sVar3);
  }
  sVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  uVar8 = (uint)CONCAT11(sVar4,sVar5);
  if (y != (int *)0x0) {
    *y = uVar8;
    uVar8 = (uint)CONCAT11(sVar2,sVar3);
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00110db8:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00110dec;
  }
  else {
    iVar7 = (*(s->io).eof)(s->io_user_data);
    if (iVar7 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_00110dec;
      goto LAB_00110db8;
    }
  }
  uVar10 = uVar8;
  if (x != (int *)0x0) {
    uVar10 = *x;
  }
  if (uVar10 != 0) {
    if (y != (int *)0x0) {
      uVar8 = *y;
    }
    if ((int)(0x10000000 / (long)(int)uVar10) < (int)uVar8) {
LAB_00110dec:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar7 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar7);
      goto LAB_00110e4d;
    }
  }
  s->img_buffer = s->img_buffer + 8;
LAB_00110e4d:
  bVar12 = 0;
  iVar7 = 0;
  do {
    if (iVar7 == 10) {
LAB_00110ee0:
      bVar13 = false;
    }
    else {
      iVar7 = iVar7 + 1;
      bVar6 = stbi__get8(s);
      uVar8 = (uint)bVar6;
      sVar2 = stbi__get8(s);
      stbi__get8(s);
      bVar6 = stbi__get8(s);
      bVar12 = bVar12 | bVar6;
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar9 = (*(s->io).eof)(s->io_user_data);
        if (iVar9 == 0) {
          bVar13 = true;
          if (sVar2 == '\b') goto LAB_00110ee2;
        }
        else if (s->read_from_callbacks != 0) goto LAB_00110ea8;
LAB_00110ed0:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_00110ee0;
      }
LAB_00110ea8:
      bVar13 = true;
      if (s->img_buffer_end <= s->img_buffer || sVar2 != '\b') goto LAB_00110ed0;
    }
LAB_00110ee2:
    if (!bVar13) {
      return 0;
    }
    if (uVar8 == 0) {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar12 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}